

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.cpp
# Opt level: O2

vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
* handlegraph::algorithms::strongly_connected_components
            (vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
             *__return_storage_ptr__,HandleGraph *handle_graph)

{
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  int64_t index;
  HandleGraph *handle_graph_local;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> stack;
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  _Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_168;
  _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_148;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  already_used;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  on_stack;
  unordered_map<handlegraph::handle_t,_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>_>
  discover_idx;
  unordered_map<handlegraph::handle_t,_handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>_>
  roots;
  
  index = 0;
  roots._M_h._M_buckets = &roots._M_h._M_single_bucket;
  roots._M_h._M_bucket_count = 1;
  roots._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  roots._M_h._M_element_count = 0;
  roots._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  roots._M_h._M_rehash_policy._M_next_resize = 0;
  roots._M_h._M_single_bucket = (__node_base_ptr)0x0;
  discover_idx._M_h._M_buckets = &discover_idx._M_h._M_single_bucket;
  discover_idx._M_h._M_bucket_count = 1;
  discover_idx._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  discover_idx._M_h._M_element_count = 0;
  discover_idx._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  stack.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  discover_idx._M_h._M_rehash_policy._M_next_resize = 0;
  discover_idx._M_h._M_single_bucket = (__node_base_ptr)0x0;
  stack.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stack.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  on_stack._M_h._M_buckets = &on_stack._M_h._M_single_bucket;
  on_stack._M_h._M_bucket_count = 1;
  on_stack._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  on_stack._M_h._M_element_count = 0;
  on_stack._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  on_stack._M_h._M_rehash_policy._M_next_resize = 0;
  on_stack._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  already_used._M_h._M_buckets = &already_used._M_h._M_single_bucket;
  already_used._M_h._M_bucket_count = 1;
  already_used._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  already_used._M_h._M_element_count = 0;
  already_used._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  already_used._M_h._M_rehash_policy._M_next_resize = 0;
  already_used._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1c8 = (code *)0x0;
  pcStack_1c0 = (code *)0x0;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  handle_graph_local = handle_graph;
  local_1d8._M_unused._M_object = operator_new(0x28);
  *(unordered_map<handlegraph::handle_t,_handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>_>
    **)local_1d8._M_unused._0_8_ = &roots;
  *(unordered_map<handlegraph::handle_t,_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>_>
    **)((long)local_1d8._M_unused._0_8_ + 8) = &discover_idx;
  *(int64_t **)((long)local_1d8._M_unused._0_8_ + 0x10) = &index;
  *(vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> **)
   ((long)local_1d8._M_unused._0_8_ + 0x18) = &stack;
  *(unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
    **)((long)local_1d8._M_unused._0_8_ + 0x20) = &on_stack;
  pcStack_1c0 = std::
                _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/strongly_connected_components.cpp:61:9)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/strongly_connected_components.cpp:61:9)>
              ::_M_manager;
  local_178 = (code *)0x0;
  pcStack_170 = (code *)0x0;
  local_188._M_unused._M_object = (void *)0x0;
  local_188._8_8_ = 0;
  local_188._M_unused._M_object = operator_new(0x38);
  *(HandleGraph ***)local_188._M_unused._0_8_ = &handle_graph_local;
  *(unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
    **)((long)local_188._M_unused._0_8_ + 8) = &on_stack;
  *(unordered_map<handlegraph::handle_t,_handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>_>
    **)((long)local_188._M_unused._0_8_ + 0x10) = &roots;
  *(unordered_map<handlegraph::handle_t,_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>_>
    **)((long)local_188._M_unused._0_8_ + 0x18) = &discover_idx;
  *(vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> **)
   ((long)local_188._M_unused._0_8_ + 0x20) = &stack;
  *(unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
    **)((long)local_188._M_unused._0_8_ + 0x28) = &already_used;
  *(vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
    **)((long)local_188._M_unused._0_8_ + 0x30) = __return_storage_ptr__;
  pcStack_170 = std::
                _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/strongly_connected_components.cpp:74:9)>
                ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/strongly_connected_components.cpp:74:9)>
              ::_M_manager;
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._M_buckets = &local_148._M_single_bucket;
  local_148._M_bucket_count = 1;
  local_148._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_148._M_element_count = 0;
  local_148._M_rehash_policy._M_max_load_factor = 1.0;
  local_148._M_rehash_policy._4_4_ = 0;
  local_148._M_rehash_policy._M_next_resize = 0;
  local_148._M_single_bucket = (__node_base_ptr)0x0;
  internal::dfs(handle_graph,(function<void_(const_handlegraph::handle_t_&)> *)&local_1d8,
                (function<void_(const_handlegraph::handle_t_&)> *)&local_188,
                (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)&local_168,
                (unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                 *)&local_148);
  std::
  _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_148);
  std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~_Vector_base
            (&local_168);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&already_used._M_h);
  std::
  _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&on_stack._M_h);
  std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~_Vector_base
            (&stack.
              super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>);
  std::
  _Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&discover_idx._M_h);
  std::
  _Hashtable<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&roots._M_h);
  return __return_storage_ptr__;
}

Assistant:

vector<unordered_set<nid_t>> strongly_connected_components(const HandleGraph* handle_graph) {
    
#ifdef debug
    cerr << "Computing strongly connected components" << endl;
#endif
    
    // What node visit step are we on?
    int64_t index = 0;
    // What's the search root from which a node was reached?
    unordered_map<handle_t, handle_t> roots;
    // At what index step was each node discovered?
    unordered_map<handle_t, int64_t> discover_idx;
    // We need our own copy of the DFS stack
    vector<handle_t> stack;
    // And our own set of nodes already on the stack
    unordered_set<handle_t> on_stack;
    // What components did we find? Because of the way strongly connected
    // components generalizes, both orientations of a node always end up in the
    // same component.
    vector<unordered_set<nid_t>> components;
    
    // A single node ID from each component we've already added, which we use
    // to deduplicate the results
    // TODO: why do we produce duplicate components in the first place?
    unordered_set<nid_t> already_used;
    
    handlegraph::algorithms::internal::dfs(*handle_graph,
        [&](const handle_t& trav) {
        // When a NodeTraversal is first visited
#ifdef debug
        cerr << "First visit to " << handle_graph->get_id(trav) << " orientation " << handle_graph->get_is_reverse(trav) << endl;
#endif
        // It is its own root
        roots[trav] = trav;
        // We discovered it at this step
        discover_idx[trav] = index++;
        // And it's on the stack
        stack.push_back(trav);
        on_stack.insert(trav);
    },
        [&](const handle_t& trav) {
        // When a NodeTraversal is done being recursed into
#ifdef debug
        cerr << "Finishing " << handle_graph->get_id(trav) << " orientation " << handle_graph->get_is_reverse(trav) << endl;
#endif
        // Go through all the NodeTraversals reachable reading onwards from this traversal.
        handle_graph->follow_edges(trav, false, [&](const handle_t& next) {
#ifdef debug
            cerr << "\tCould next reach " << handle_graph->get_id(next) << " orientation " << handle_graph->get_is_reverse(next) << endl;
#endif
            if (on_stack.count(next)) {
                // If any of those NodeTraversals are on the stack already
#ifdef debug
                cerr << "\t\tIt is already on the stack, so maybe we want its root" << endl;
#endif
                auto& node_root = roots[trav];
                auto& next_root = roots[next];
#ifdef debug
                cerr << "\t\t\tWe have root " << handle_graph->get_id(node_root) << " orientation "
                << handle_graph->get_is_reverse(node_root)
                << " discovered at time " << discover_idx[node_root] << endl;
                cerr << "\t\t\tThey have root " << handle_graph->get_id(next_root) << " orientation "
                << handle_graph->get_is_reverse(next_root)
                << " discovered at time " << discover_idx[next_root] << endl;
#endif
                // Adopt the root of the NodeTraversal that was discovered first.
                roots[trav] = discover_idx[node_root] < discover_idx[next_root] ?
                node_root : next_root;
#ifdef debug
                cerr << "\t\t\tWinning root: " << handle_graph->get_id(roots[trav]) << " orientation "
                << handle_graph->get_is_reverse(roots[trav]) << endl;
#endif
            }
            return true;
        });
        
        if (roots[trav] == trav) {
            // If we didn't find a better root
#ifdef debug
            cerr << "\tWe are our own best root, so glom up everything under us" << endl;
#endif
            handle_t other;
            bool is_duplicate = false;
            unordered_set<nid_t> component;
            do
            {
                // Grab everything that was put on the DFS stack below us
                // and put it in our component.
                other = stack.back();
                stack.pop_back();
                on_stack.erase(other);
                
                nid_t node_id = handle_graph->get_id(other);
                
                if (already_used.count(node_id)) {
                    is_duplicate = true;
                    break;
                }
                
                component.insert(node_id);
#ifdef debug
                cerr << "\t\tSnarf up node " << handle_graph->get_id(other) << " from handle in orientation "
                << handle_graph->get_is_reverse(other) << endl;
#endif
            } while (other != trav);
            
            if (!is_duplicate) {
                // use one node ID to mark this component as finished
                already_used.insert(*component.begin());
                // add it to the return valuse
                components.emplace_back(std::move(component));
            }
        }
    },
        vector<handle_t>(), unordered_set<handle_t>());
    
    return components;
}